

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O0

char * getrule(char *strp,rule *rulep)

{
  int iVar1;
  char *pcVar2;
  rule *rulep_local;
  char *strp_local;
  
  if (*strp == 'J') {
    rulep->type = JULIAN_DAY;
    rulep_local = (rule *)getnum(strp + 1,&rulep->day,1,0x16d);
  }
  else if (*strp == 'M') {
    rulep->type = MONTH_NTH_DAY_OF_WEEK;
    pcVar2 = getnum(strp + 1,&rulep->mon,1,0xc);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '.') {
      return (char *)0x0;
    }
    pcVar2 = getnum(pcVar2 + 1,&rulep->week,1,5);
    if (pcVar2 == (char *)0x0) {
      return (char *)0x0;
    }
    if (*pcVar2 != '.') {
      return (char *)0x0;
    }
    rulep_local = (rule *)getnum(pcVar2 + 1,&rulep->day,0,6);
  }
  else {
    iVar1 = isdigit((uint)(byte)*strp);
    if (iVar1 == 0) {
      return (char *)0x0;
    }
    rulep->type = DAY_OF_YEAR;
    rulep_local = (rule *)getnum(strp,&rulep->day,0,0x16d);
  }
  if (rulep_local == (rule *)0x0) {
    strp_local = (char *)0x0;
  }
  else {
    if ((char)rulep_local->type == 0x2f) {
      rulep_local = (rule *)getoffset((char *)((long)&rulep_local->type + 1),&rulep->time);
    }
    else {
      rulep->time = 0x1c20;
    }
    strp_local = (char *)rulep_local;
  }
  return strp_local;
}

Assistant:

static const char * getrule( const char * strp, struct rule * rulep )
{
    if ( *strp == 'J' )
    {
        /* Julian day. */
        rulep->type = JULIAN_DAY;
        ++strp;
        strp = getnum( strp, &rulep->day, 1, DAYSPERNYEAR );
    }
    else if ( *strp == 'M' )
    {
        /* Month, week, day. */
        rulep->type = MONTH_NTH_DAY_OF_WEEK;
        ++strp;
        strp = getnum( strp, &rulep->mon, 1, MONSPERYEAR );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->week, 1, 5 );

        if ( strp == NULL )
        {
            return NULL;
        }

        if ( *strp++ != '.' )
        {
            return NULL;
        }

        strp = getnum( strp, &rulep->day, 0, DAYSPERWEEK - 1 );
    }
    else if ( isdigit( (unsigned char)*strp ) )
    {
        /* Day of year. */
        rulep->type = DAY_OF_YEAR;
        strp = getnum( strp, &rulep->day, 0, DAYSPERLYEAR - 1 );
    }
    else
    {
        return NULL;        /* invalid format */
    }

    if ( strp == NULL )
    {
        return NULL;
    }

    if ( *strp == '/' )
    {
        /* Time specified. */
        ++strp;
        strp = getoffset( strp, &rulep->time );
    }
    else
    {
        rulep->time = 2 * SECSPERHOUR;    /* default = 2:00:00 */
    }

    return strp;
}